

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcarith.c
# Opt level: O2

void start_pass(j_decompress_ptr cinfo)

{
  int iVar1;
  jpeg_entropy_decoder *pjVar2;
  jpeg_error_mgr *pjVar3;
  int (*paiVar4) [64];
  jpeg_component_info *pjVar5;
  long lVar6;
  code *pcVar7;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var8;
  void *__s;
  int iVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int (*paiVar14) [64];
  
  pjVar2 = cinfo->entropy;
  iVar1 = cinfo->Ss;
  if (cinfo->progressive_mode == 0) {
    if ((((iVar1 != 0) || (cinfo->Ah != 0)) || (cinfo->Al != 0)) || (cinfo->Se < 0x3f)) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x7a;
      (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
    }
    pcVar7 = decode_mcu;
    goto LAB_001111b8;
  }
  iVar9 = cinfo->Se;
  if (iVar1 == 0) {
    if (iVar9 == 0) goto LAB_00110fef;
LAB_00111010:
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x10;
    (pjVar3->msg_parm).i[0] = iVar1;
    (cinfo->err->msg_parm).i[1] = cinfo->Se;
    (cinfo->err->msg_parm).i[2] = cinfo->Ah;
    (cinfo->err->msg_parm).i[3] = cinfo->Al;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  else {
    if ((0x3f < iVar9 || iVar9 < iVar1) || (cinfo->comps_in_scan != 1)) goto LAB_00111010;
LAB_00110fef:
    if (cinfo->Ah == 0) {
      iVar9 = cinfo->Al;
    }
    else {
      iVar9 = cinfo->Ah + -1;
      if (iVar9 != cinfo->Al) goto LAB_00111010;
    }
    if (0xd < iVar9) goto LAB_00111010;
  }
  for (lVar12 = 0; lVar12 < cinfo->comps_in_scan; lVar12 = lVar12 + 1) {
    iVar1 = cinfo->cur_comp_info[lVar12]->component_index;
    paiVar4 = cinfo->coef_bits;
    paiVar14 = paiVar4 + iVar1;
    iVar9 = cinfo->num_components;
    iVar10 = cinfo->Ss;
    if (iVar10 == 0) {
      iVar10 = 0;
    }
    else if ((*paiVar14)[0] < 0) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x73;
      (pjVar3->msg_parm).i[0] = iVar1;
      (cinfo->err->msg_parm).i[1] = 0;
      (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      iVar10 = cinfo->Ss;
    }
    if (0 < iVar10) {
      iVar10 = 1;
    }
    lVar6 = (long)iVar10;
    while( true ) {
      uVar11 = cinfo->Se;
      uVar13 = 9;
      if (9 < (int)uVar11) {
        uVar13 = (ulong)uVar11;
      }
      if ((long)uVar13 < lVar6) break;
      iVar10 = 0;
      if (1 < cinfo->input_scan_number) {
        iVar10 = (*paiVar14)[lVar6];
      }
      paiVar4[iVar9 + iVar1][lVar6] = iVar10;
      lVar6 = lVar6 + 1;
    }
    for (lVar6 = (long)cinfo->Ss; lVar6 <= (int)uVar11; lVar6 = lVar6 + 1) {
      iVar9 = (*paiVar14)[lVar6];
      if (iVar9 < 1) {
        iVar9 = 0;
      }
      if (cinfo->Ah != iVar9) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x73;
        (pjVar3->msg_parm).i[0] = iVar1;
        (cinfo->err->msg_parm).i[1] = (int)lVar6;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      }
      (*paiVar14)[lVar6] = cinfo->Al;
      uVar11 = cinfo->Se;
    }
  }
  if (cinfo->Ah == 0) {
    if (cinfo->Ss == 0) {
      pcVar7 = decode_mcu_DC_first;
    }
    else {
      pcVar7 = decode_mcu_AC_first;
    }
  }
  else if (cinfo->Ss == 0) {
    pcVar7 = decode_mcu_DC_refine;
  }
  else {
    pcVar7 = decode_mcu_AC_refine;
  }
LAB_001111b8:
  pjVar2->decode_mcu = pcVar7;
  lVar12 = 0;
  do {
    if (cinfo->comps_in_scan <= lVar12) {
      pjVar2[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
      pjVar2[1].decode_mcu = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0;
      pjVar2[1].insufficient_data = -0x10;
      pjVar2->insufficient_data = 0;
      *(uint *)((long)&pjVar2[3].start_pass + 4) = cinfo->restart_interval;
      return;
    }
    pjVar5 = cinfo->cur_comp_info[lVar12];
    if (cinfo->progressive_mode == 0) {
LAB_001111f9:
      iVar1 = pjVar5->dc_tbl_no;
      uVar13 = (ulong)iVar1;
      if (0xf < uVar13) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x7d;
        (pjVar3->msg_parm).i[0] = iVar1;
        (*cinfo->err->error_exit)((j_common_ptr)cinfo);
      }
      p_Var8 = (&pjVar2[3].decode_mcu)[uVar13];
      if (p_Var8 == (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)0x0) {
        p_Var8 = (_func_boolean_j_decompress_ptr_JBLOCKROW_ptr *)
                 (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x40);
        (&pjVar2[3].decode_mcu)[uVar13] = p_Var8;
      }
      *(undefined8 *)(p_Var8 + 0x30) = 0;
      *(undefined8 *)(p_Var8 + 0x38) = 0;
      *(undefined8 *)(p_Var8 + 0x20) = 0;
      *(undefined8 *)(p_Var8 + 0x28) = 0;
      *(undefined8 *)(p_Var8 + 0x10) = 0;
      *(undefined8 *)(p_Var8 + 0x18) = 0;
      *(undefined8 *)p_Var8 = 0;
      *(undefined8 *)(p_Var8 + 8) = 0;
      *(undefined4 *)(&pjVar2[1].field_0x14 + lVar12 * 4) = 0;
      *(undefined4 *)((long)&pjVar2[2].decode_mcu + lVar12 * 4 + 4) = 0;
      if ((cinfo->progressive_mode == 0) || (cinfo->Ss != 0)) {
LAB_00111267:
        iVar1 = pjVar5->ac_tbl_no;
        uVar13 = (ulong)iVar1;
        if (0xf < uVar13) {
          pjVar3 = cinfo->err;
          pjVar3->msg_code = 0x7d;
          (pjVar3->msg_parm).i[0] = iVar1;
          (*cinfo->err->error_exit)((j_common_ptr)cinfo);
        }
        __s = *(void **)(&pjVar2[8].insufficient_data + uVar13 * 2);
        if (__s == (void *)0x0) {
          __s = (*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x100);
          *(void **)(&pjVar2[8].insufficient_data + uVar13 * 2) = __s;
        }
        memset(__s,0,0x100);
      }
    }
    else {
      if (cinfo->Ss != 0) goto LAB_00111267;
      if (cinfo->Ah == 0) goto LAB_001111f9;
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

METHODDEF(void)
start_pass(j_compress_ptr cinfo, boolean gather_statistics)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr)cinfo->entropy;
  int ci, tbl;
  jpeg_component_info *compptr;

  if (gather_statistics)
    /* Make sure to avoid that in the master control logic!
     * We are fully adaptive here and need no extra
     * statistics gathering pass!
     */
    ERREXIT(cinfo, JERR_NOT_COMPILED);

  /* We assume jcmaster.c already validated the progressive scan parameters. */

  /* Select execution routines */
  if (cinfo->progressive_mode) {
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
        entropy->pub.encode_mcu = encode_mcu_DC_first;
      else
        entropy->pub.encode_mcu = encode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
        entropy->pub.encode_mcu = encode_mcu_DC_refine;
      else
        entropy->pub.encode_mcu = encode_mcu_AC_refine;
    }
  } else
    entropy->pub.encode_mcu = encode_mcu;

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    /* DC needs no table for refinement scan */
    if (cinfo->progressive_mode == 0 || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
        ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
        entropy->dc_stats[tbl] = (unsigned char *)(*cinfo->mem->alloc_small)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    /* AC needs no table when not present */
    if (cinfo->progressive_mode == 0 || cinfo->Se) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
        ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
        entropy->ac_stats[tbl] = (unsigned char *)(*cinfo->mem->alloc_small)
          ((j_common_ptr)cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
#ifdef CALCULATE_SPECTRAL_CONDITIONING
      if (cinfo->progressive_mode)
        /* Section G.1.3.2: Set appropriate arithmetic conditioning value Kx */
        cinfo->arith_ac_K[tbl] = cinfo->Ss +
                                 ((8 + cinfo->Se - cinfo->Ss) >> 4);
#endif
    }
  }

  /* Initialize arithmetic encoding variables */
  entropy->c = 0;
  entropy->a = 0x10000L;
  entropy->sc = 0;
  entropy->zc = 0;
  entropy->ct = 11;
  entropy->buffer = -1;  /* empty */

  /* Initialize restart stuff */
  entropy->restarts_to_go = cinfo->restart_interval;
  entropy->next_restart_num = 0;
}